

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O0

void __thiscall rsg::VariableType::VariableType(VariableType *this)

{
  VariableType *this_local;
  
  this->m_baseType = TYPE_VOID;
  this->m_precision = PRECISION_NONE;
  std::__cxx11::string::string((string *)&this->m_typeName);
  this->m_numElements = 0;
  this->m_elementType = (VariableType *)0x0;
  std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::vector
            (&this->m_members);
  return;
}

Assistant:

inline VariableType::VariableType (void)
	: m_baseType	(TYPE_VOID)
	, m_precision	(PRECISION_NONE)
	, m_typeName	()
	, m_numElements	(0)
	, m_elementType	(DE_NULL)
{
}